

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O1

string * __thiscall
soul::getReadableDescriptionOfByteSize_abi_cxx11_
          (string *__return_storage_ptr__,soul *this,uint64_t bytes)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  soul *psVar5;
  size_type *psVar6;
  char cVar7;
  double dVar8;
  undefined1 auVar9 [16];
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  uint local_40;
  long local_38 [2];
  char *local_28;
  
  if (this == (soul *)0x1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"1 byte","");
  }
  else {
    if (this < (soul *)0x400) {
      cVar7 = '\x01';
      if ((soul *)0x9 < this) {
        psVar5 = this;
        cVar3 = '\x04';
        do {
          cVar7 = cVar3;
          if (psVar5 < (soul *)0x64) {
            cVar7 = cVar7 + -2;
            goto LAB_001b9bc6;
          }
          if (psVar5 < (soul *)0x3e8) {
            cVar7 = cVar7 + -1;
            goto LAB_001b9bc6;
          }
          if (psVar5 < (soul *)0x2710) goto LAB_001b9bc6;
          bVar1 = (soul *)0x1869f < psVar5;
          psVar5 = (soul *)((ulong)psVar5 / 10000);
          cVar3 = cVar7 + '\x04';
        } while (bVar1);
        cVar7 = cVar7 + '\x01';
      }
LAB_001b9bc6:
      local_48 = local_38;
      std::__cxx11::string::_M_construct((ulong)&local_48,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_48,local_40,(unsigned_long)this);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_58[0] = local_38[0];
      plVar4 = local_48;
      if (local_48 == local_38) {
        return __return_storage_ptr__;
      }
    }
    else {
      auVar9._8_4_ = (int)((ulong)this >> 0x20);
      auVar9._0_8_ = this;
      auVar9._12_4_ = 0x45300000;
      dVar8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0);
      if (this < (soul *)0x100000) {
        local_28 = choc::text::FloatToStringBuffer<double>::writeAndGetEnd
                             ((char *)&local_48,dVar8 * 0.0009765625,1);
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,&local_48,local_28);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_68);
      }
      else if (this < (soul *)0x40000000) {
        local_28 = choc::text::FloatToStringBuffer<double>::writeAndGetEnd
                             ((char *)&local_48,dVar8 * 9.5367431640625e-07,1);
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,&local_48,local_28);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_68);
      }
      else {
        local_28 = choc::text::FloatToStringBuffer<double>::writeAndGetEnd
                             ((char *)&local_48,dVar8 * 9.313225746154785e-10,1);
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,&local_48,local_28);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_68);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = local_68[0];
      if (local_68[0] == local_58) {
        return __return_storage_ptr__;
      }
    }
    operator_delete(plVar4,local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getReadableDescriptionOfByteSize (uint64_t bytes)
{
    if (bytes == 1)                  return "1 byte";
    if (bytes < 1024)                return std::to_string (bytes) + " bytes";
    if (bytes < 1024 * 1024)         return choc::text::floatToString (double (bytes) / 1024.0, 1)                     + " KB";
    if (bytes < 1024 * 1024 * 1024)  return choc::text::floatToString (double (bytes) / (1024.0 * 1024.0), 1)          + " MB";
    else                             return choc::text::floatToString (double (bytes) / (1024.0 * 1024.0 * 1024.0), 1) + " GB";
}